

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float value;
  double value_00;
  string *text;
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *pEVar4;
  LogMessage *other;
  undefined7 in_register_00000009;
  long i;
  java *this_00;
  char *pcVar5;
  string *this_01;
  SubstituteArg *in_stack_fffffffffffffdc8;
  LogMessage local_230;
  SubstituteArg local_1f8;
  string local_1c8;
  char *local_1a8;
  int local_1a0;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  this_00 = this;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(int)i);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    SimpleItoa_abi_cxx11_((string *)&local_230,*(protobuf **)(this + 0xa0),i);
    std::operator+(__return_storage_ptr__,(string *)&local_230,"L");
    break;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_((string *)&local_230,*(protobuf **)(this + 0xa0),i);
    std::operator+(__return_storage_ptr__,(string *)&local_230,"L");
    break;
  case CPPTYPE_DOUBLE:
    value_00 = *(double *)(this + 0xa0);
    if (INFINITY <= value_00) {
      pcVar5 = "Double.POSITIVE_INFINITY";
      goto LAB_0024e4c6;
    }
    if (value_00 <= -INFINITY) {
      pcVar5 = "Double.NEGATIVE_INFINITY";
      goto LAB_0024e4c6;
    }
    if (NAN(value_00)) {
      pcVar5 = "Double.NaN";
      goto LAB_0024e4c6;
    }
    SimpleDtoa_abi_cxx11_((string *)&local_230,(protobuf *)this_00,value_00);
    std::operator+(__return_storage_ptr__,(string *)&local_230,"D");
    break;
  case CPPTYPE_FLOAT:
    value = *(float *)(this + 0xa0);
    if (INFINITY <= value) {
      pcVar5 = "Float.POSITIVE_INFINITY";
      goto LAB_0024e4c6;
    }
    if (value <= -INFINITY) {
      pcVar5 = "Float.NEGATIVE_INFINITY";
      goto LAB_0024e4c6;
    }
    if (NAN(value)) {
      pcVar5 = "Float.NaN";
      goto LAB_0024e4c6;
    }
    SimpleFtoa_abi_cxx11_((string *)&local_230,(protobuf *)this_00,value);
    std::operator+(__return_storage_ptr__,(string *)&local_230,"F");
    break;
  case CPPTYPE_BOOL:
    pcVar5 = "false";
    if (this[0xa0] != (java)0x0) {
      pcVar5 = "true";
    }
    goto LAB_0024e4c6;
  case CPPTYPE_ENUM:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_1f8,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor_00,SUB81(field,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   (string *)&local_1f8,".");
    pEVar4 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pEVar4);
LAB_0024e476:
    std::__cxx11::string::~string((string *)&local_230);
    this_01 = (string *)&local_1f8;
    goto LAB_0024e5b3;
  case CPPTYPE_STRING:
    TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar3 == TYPE_BYTES) {
      if (this[0x98] != (java)0x1) {
        pcVar5 = "com.google.protobuf.ByteString.EMPTY";
        goto LAB_0024e4c6;
      }
      CEscape(&local_1c8,*(string **)(this + 0xa0));
      local_1f8.text_ = (pointer)0x0;
      local_1f8.size_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_230._0_8_ = local_1c8._M_dataplus._M_p;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1a8 = (char *)0x0;
      local_230.filename_._0_4_ = (undefined4)local_1c8._M_string_length;
      local_1a0 = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                 (char *)&local_230,&local_1f8,&local_58,&local_88,&local_b8,&local_e8,&local_118,
                 &local_148,&local_178,(SubstituteArg *)&local_1a8,in_stack_fffffffffffffdc8);
    }
    else {
      text = *(string **)(this + 0xa0);
      bVar1 = AllAscii(text);
      if (bVar1) {
        CEscape((string *)&local_1f8,text);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_230,"\"",(string *)&local_1f8);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_230,"\"");
        goto LAB_0024e476;
      }
      CEscape(&local_1c8,text);
      local_1f8.text_ = (pointer)0x0;
      local_1f8.size_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_230._0_8_ = local_1c8._M_dataplus._M_p;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1a8 = (char *)0x0;
      local_230.filename_._0_4_ = (undefined4)local_1c8._M_string_length;
      local_1a0 = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                 (char *)&local_230,&local_1f8,&local_58,&local_88,&local_b8,&local_e8,&local_118,
                 &local_148,&local_178,(SubstituteArg *)&local_1a8,in_stack_fffffffffffffdc8);
    }
    this_01 = (string *)&local_1c8;
    goto LAB_0024e5b3;
  case CPPTYPE_MESSAGE:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_230,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    std::operator+(__return_storage_ptr__,(string *)&local_230,".getDefaultInstance()");
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_230,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1df);
    other = internal::LogMessage::operator<<(&local_230,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_1f8,other);
    internal::LogMessage::~LogMessage(&local_230);
    pcVar5 = "";
LAB_0024e4c6:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&local_230);
    return __return_storage_ptr__;
  }
  this_01 = (string *)&local_230;
LAB_0024e5b3:
  std::__cxx11::string::~string(this_01);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field, bool immutable,
                    ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
          ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}